

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::InputLayout::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 310 es                      \nlayout(location = 4) in vec4 b;      \nlayout(location = 7) in mat2x3 d;    \nlayout(location = 5) in float c;     \nlayout(location = 12) in uint f;     \nlayout(location = 13) in vec3 g;     \nlayout(location = 0) in mat4 a;      \nlayout(location = 15) in int h;      \nlayout(location = 11) in vec2 e;     \nvoid main(void)                      \n{                                    \n   vec4 pos;                                              \n   pos.w = float(h) + g.x + g.y + d[1][1];                \n   pos.y = float(b.x) * c + c + d[0][0];                  \n   pos.x = a[0].x + a[1].y + a[2].z + a[3].w;             \n   pos.z = d[0][1] + float(e.x) * float(f) + d[1][0];     \n   gl_Position = pos;                                     \n}"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 310 es                      \n"
			   "layout(location = 4) in vec4 b;      \n"
			   "layout(location = 7) in mat2x3 d;    \n"
			   "layout(location = 5) in float c;     \n"
			   "layout(location = 12) in uint f;     \n"
			   "layout(location = 13) in vec3 g;     \n"
			   "layout(location = 0) in mat4 a;      \n"
			   "layout(location = 15) in int h;      \n"
			   "layout(location = 11) in vec2 e;     \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "   vec4 pos;                                              \n"
			   "   pos.w = float(h) + g.x + g.y + d[1][1];                \n"
			   "   pos.y = float(b.x) * c + c + d[0][0];                  \n"
			   "   pos.x = a[0].x + a[1].y + a[2].z + a[3].w;             \n"
			   "   pos.z = d[0][1] + float(e.x) * float(f) + d[1][0];     \n"
			   "   gl_Position = pos;                                     \n"
			   "}";
	}